

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O3

void __thiscall ParseInt16_Both_Test::TestBody(ParseInt16_Both_Test *this)

{
  anon_unknown.dwarf_bcdf7::AssertInt16Equals(0,"0",Both);
  anon_unknown.dwarf_bcdf7::AssertInt16Equals(1000,"1000",Both);
  anon_unknown.dwarf_bcdf7::AssertInt16Equals(0x3039,"12345",Both);
  anon_unknown.dwarf_bcdf7::AssertInt16Equals(0x7fff,"32767",Both);
  anon_unknown.dwarf_bcdf7::AssertInt16Equals(0xffff,"65535",Both);
  anon_unknown.dwarf_bcdf7::AssertInt16Equals(0xcafe,"0xcafe",Both);
  anon_unknown.dwarf_bcdf7::AssertInt16Equals(0x7fff,"0x7fff",Both);
  anon_unknown.dwarf_bcdf7::AssertInt16Equals(0x8000,"0x8000",Both);
  anon_unknown.dwarf_bcdf7::AssertInt16Equals(0xffff,"0xffff",Both);
  return;
}

Assistant:

TEST(ParseInt16, Both) {
  AssertInt16Equals(0, "0");
  AssertInt16Equals(1000, "1000");
  AssertInt16Equals(12345, "12345");
  AssertInt16Equals(32767, "32767");
  AssertInt16Equals(65535, "65535");
  AssertInt16Equals(0xcafe, "0xcafe");
  AssertInt16Equals(0x7fff, "0x7fff");
  AssertInt16Equals(0x8000, "0x8000");
  AssertInt16Equals(0xffff, "0xffff");
}